

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O1

void __thiscall adios2::core::Engine::RemoveCreatedVars(Engine *this)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (this->m_CreatedVars)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    IO::RemoveVariable(this->m_IO,(string *)(p_Var1[1]._M_nxt + 1));
  }
  std::
  _Hashtable<const_adios2::core::VariableBase_*,_const_adios2::core::VariableBase_*,_std::allocator<const_adios2::core::VariableBase_*>,_std::__detail::_Identity,_std::equal_to<const_adios2::core::VariableBase_*>,_std::hash<const_adios2::core::VariableBase_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->m_CreatedVars)._M_h);
  return;
}

Assistant:

void Engine::RemoveCreatedVars()
{
    for (auto &VarRec : m_CreatedVars)
    {
        m_IO.RemoveVariable(VarRec->m_Name);
    }
    m_CreatedVars.clear();
}